

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O1

ssize_t __thiscall bsplib::A2A::send(A2A *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pointer puVar1;
  int iVar2;
  unsigned_long uVar3;
  size_t sVar4;
  pointer pcVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (__fd < 0) {
    __assert_fail("dst_pid >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0x47,"void *bsplib::A2A::send(int, const void *, std::size_t)");
  }
  uVar7 = (ulong)(uint)__fd;
  iVar2 = this->m_nprocs;
  if (iVar2 <= __fd) {
    __assert_fail("dst_pid < m_nprocs",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0x48,"void *bsplib::A2A::send(int, const void *, std::size_t)");
  }
  uVar12 = this->m_send_cap;
  if (uVar12 != (ulong)((long)(this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start) / (ulong)(long)iVar2) {
    __assert_fail("m_send_cap == m_send_bufs.size() / m_nprocs",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0x4a,"void *bsplib::A2A::send(int, const void *, std::size_t)");
  }
  uVar3 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar7];
  uVar13 = uVar3 + __n;
  if (uVar12 < uVar13) {
    uVar11 = uVar12 * 2;
    if (uVar12 * 2 <= uVar13) {
      uVar11 = uVar13;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->m_send_bufs,(long)iVar2 * uVar11);
    lVar9 = (long)this->m_nprocs;
    lVar8 = lVar9;
    if (0 < lVar9) {
      do {
        uVar12 = uVar11 * lVar9;
        uVar13 = uVar11 * (lVar9 + -1);
        if (uVar13 <= uVar12 && uVar12 - uVar13 != 0) {
          sVar4 = this->m_send_cap;
          do {
            pcVar5 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar5[uVar12 - 1] = pcVar5[(sVar4 - uVar11) * (lVar8 + -1) + -1 + uVar12];
            uVar12 = uVar12 - 1;
          } while (uVar13 < uVar12);
        }
        bVar6 = 1 < lVar9;
        lVar9 = lVar9 + -1;
        lVar8 = lVar8 + -1;
      } while (bVar6);
    }
    this->m_send_cap = uVar11;
  }
  puVar1 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar7;
  *puVar1 = *puVar1 + __n;
  pvVar10 = memcpy((this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar3 + uVar7 * this->m_send_cap,__buf,__n);
  return (ssize_t)pvVar10;
}

Assistant:

void * A2A::send( int dst_pid, const void * data, std::size_t size )
{
    assert( dst_pid >= 0 );
    assert( dst_pid < m_nprocs );

    assert( m_send_cap == m_send_bufs.size() / m_nprocs );

    std::size_t offset = m_send_sizes[ dst_pid ];
    if ( m_send_cap < offset + size ) {
        std::size_t new_cap =
           std::max( 2 * m_send_cap , offset + size );

        m_send_bufs.resize( m_nprocs * new_cap );
        for ( int p = m_nprocs; p > 0; --p ) {
            std::size_t displ = new_cap - m_send_cap;

            for ( size_t i = p*new_cap; i > (p-1)*new_cap; --i) {
                m_send_bufs[i-1] = m_send_bufs[i-displ*(p-1)-1];
            }
        }  
        m_send_cap = new_cap;
    }
    m_send_sizes[ dst_pid ] += size;
    void * send_buf = m_send_bufs.data() + dst_pid * m_send_cap + offset;
    std::memcpy( send_buf , data, size );
    return send_buf;
}